

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O1

HighsInt __thiscall HighsLpRelaxation::LpRow::getRowLen(LpRow *this,HighsMipSolver *mipsolver)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  
  if (this->origin == kModel) {
    lVar1 = *(long *)&(((mipsolver->mipdata_)._M_t.
                        super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                        .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->ARstart_)
                      .super__Vector_base<int,_std::allocator<int>_>._M_impl;
    piVar3 = (int *)(lVar1 + (long)this->index * 4);
    lVar1 = lVar1 + (long)this->index * 4;
  }
  else {
    if (this->origin != kCutPool) {
      return -1;
    }
    lVar2 = *(long *)&(((mipsolver->mipdata_)._M_t.
                        super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                        .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->cutpool).
                      matrix_.ARrange_;
    lVar1 = lVar2 + (long)this->index * 8;
    piVar3 = (int *)(lVar2 + (long)this->index * 8);
  }
  return *(int *)(lVar1 + 4) - *piVar3;
}

Assistant:

HighsInt HighsLpRelaxation::LpRow::getRowLen(
    const HighsMipSolver& mipsolver) const {
  switch (origin) {
    case kCutPool:
      return mipsolver.mipdata_->cutpool.getRowLength(index);
    case kModel:
      return mipsolver.mipdata_->ARstart_[index + 1] -
             mipsolver.mipdata_->ARstart_[index];
  };

  assert(false);
  return -1;
}